

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Widget::Widget(Widget *this)

{
  QHBoxLayout *this_00;
  PageView *this_01;
  TextLabel *pTVar1;
  QLatin1String latin1;
  QLatin1String latin1_00;
  QLatin1String latin1_01;
  QArrayDataPointer<char16_t> local_60;
  QFont f;
  QTextOption opt;
  
  QWidget::QWidget(&this->super_QWidget,0,0);
  *(undefined ***)this = &PTR_metaObject_001a6320;
  *(undefined ***)&this->field_0x10 = &PTR__Widget_001a64d0;
  this_00 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_00,&this->super_QWidget);
  this_01 = (PageView *)operator_new(0x30);
  QtMWidgets::PageView::PageView(this_01,&this->super_QWidget);
  QBoxLayout::addWidget(this_00,this_01,0,0);
  pTVar1 = (TextLabel *)operator_new(0x30);
  QtMWidgets::TextLabel::TextLabel(pTVar1,(QWidget *)this_01,(WindowFlags)0x0);
  QtMWidgets::TextLabel::textOption((TextLabel *)&opt);
  _opt = _opt & 0xfffffe00 | 0x84;
  QFont::QFont(&f,(QFont *)(*(long *)&pTVar1->field_0x20 + 0x38));
  QFont::setPointSize((int)&f);
  QFont::setWeight((Weight)&f);
  QtMWidgets::TextLabel::setTextOption(pTVar1,&opt);
  QtMWidgets::TextLabel::setFont(pTVar1,&f);
  latin1.m_data = "1";
  latin1.m_size = 1;
  QString::QString((QString *)&local_60,latin1);
  QtMWidgets::TextLabel::setText(pTVar1,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QtMWidgets::PageView::addWidget(this_01,(QWidget *)pTVar1);
  pTVar1 = (TextLabel *)operator_new(0x30);
  QtMWidgets::TextLabel::TextLabel(pTVar1,(QWidget *)this_01,(WindowFlags)0x0);
  QtMWidgets::TextLabel::setTextOption(pTVar1,&opt);
  QtMWidgets::TextLabel::setFont(pTVar1,&f);
  latin1_00.m_data = "2";
  latin1_00.m_size = 1;
  QString::QString((QString *)&local_60,latin1_00);
  QtMWidgets::TextLabel::setText(pTVar1,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QtMWidgets::PageView::addWidget(this_01,(QWidget *)pTVar1);
  pTVar1 = (TextLabel *)operator_new(0x30);
  QtMWidgets::TextLabel::TextLabel(pTVar1,(QWidget *)this_01,(WindowFlags)0x0);
  QtMWidgets::TextLabel::setTextOption(pTVar1,&opt);
  QtMWidgets::TextLabel::setFont(pTVar1,&f);
  latin1_01.m_data = "3";
  latin1_01.m_size = 1;
  QString::QString((QString *)&local_60,latin1_01);
  QtMWidgets::TextLabel::setText(pTVar1,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QtMWidgets::PageView::addWidget(this_01,(QWidget *)pTVar1);
  QWidget::resize(&this->super_QWidget,0x140,0x1e0);
  QFont::~QFont(&f);
  QTextOption::~QTextOption(&opt);
  return;
}

Assistant:

Widget()
	{
		QHBoxLayout * l = new QHBoxLayout( this );

		QtMWidgets::PageView * view = new QtMWidgets::PageView( this );

		l->addWidget( view );

		QtMWidgets::TextLabel * page1 = new QtMWidgets::TextLabel( view );

		QTextOption opt = page1->textOption();
		opt.setAlignment( Qt::AlignCenter );

		QFont f = page1->font();
		f.setPointSize( 150 );
		f.setBold( true );

		page1->setTextOption( opt );
		page1->setFont( f );
		page1->setText( QLatin1String( "1" ) );
		view->addWidget( page1 );

		QtMWidgets::TextLabel * page2 = new QtMWidgets::TextLabel( view );

		page2->setTextOption( opt );
		page2->setFont( f );
		page2->setText( QLatin1String( "2" ) );
		view->addWidget( page2 );

		QtMWidgets::TextLabel * page3 = new QtMWidgets::TextLabel( view );

		page3->setTextOption( opt );
		page3->setFont( f );
		page3->setText( QLatin1String( "3" ) );
		view->addWidget( page3 );

		resize( 320, 480 );
	}